

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O1

int AF_A_JumpIfInTargetInventory
              (VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  undefined8 *puVar1;
  PClass *pPVar2;
  int iVar3;
  undefined8 uVar4;
  PClass *pPVar5;
  VMValue *pVVar6;
  AActor *self;
  AActor *owner;
  char *__assertion;
  bool bVar7;
  bool bVar8;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      puVar1 = (undefined8 *)(param->field_0).field_1.a;
      self = (AActor *)param;
      if (puVar1 != (undefined8 *)0x0) {
        pVVar6 = param;
        if (puVar1[1] == 0) {
          uVar4 = (**(code **)*puVar1)(puVar1);
          puVar1[1] = uVar4;
        }
        pPVar5 = (PClass *)puVar1[1];
        bVar7 = pPVar5 == (PClass *)0x0;
        bVar8 = !bVar7;
        self = (AActor *)CONCAT71((int7)((ulong)pVVar6 >> 8),pPVar5 == pPVar2 || bVar7);
        if (pPVar5 != pPVar2 && !bVar7) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar8 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar2) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (!bVar8) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00644885;
        }
      }
      owner = (AActor *)puVar1[0x3b];
      if ((owner != (AActor *)0x0) &&
         (((owner->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        puVar1[0x3b] = 0;
        owner = (AActor *)0x0;
      }
      iVar3 = DoJumpIfInventory(owner,self,param,numparam,ret,numret);
      return iVar3;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_00644885:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                ,0x540,
                "int AF_A_JumpIfInTargetInventory(VMFrameStack *, VMValue *, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_JumpIfInTargetInventory)
{
	PARAM_SELF_PROLOGUE(AActor);
	return DoJumpIfInventory(self->target, self, param, numparam, ret, numret);
}